

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O1

int FBX::getProperty<int>(Node *node,string *property,int *fallback)

{
  pointer pcVar1;
  size_t __n;
  pointer pNVar2;
  int iVar3;
  variant_alternative_t<6UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar4;
  uint *puVar5;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  Node *prop;
  bool bVar8;
  Node properties;
  string local_d0;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_b0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  long *local_88 [2];
  long local_78 [2];
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_68;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_50;
  
  paVar7 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Properties70","");
  findNodes(&local_b0,node,&local_d0);
  local_98 = (undefined4)
             (local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start)->propertyCount;
  uStack_94 = *(undefined4 *)
               ((long)&(local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                        super__Vector_impl_data._M_start)->propertyCount + 4);
  uStack_90 = (undefined4)
              (local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->propertyLength;
  uStack_8c = *(undefined4 *)
               ((long)&(local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                        super__Vector_impl_data._M_start)->propertyLength + 4);
  local_88[0] = local_78;
  pcVar1 = ((local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start)->id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,
             pcVar1 + ((local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                        super__Vector_impl_data._M_start)->id)._M_string_length);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::vector
            (&local_68,
             &(local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->children);
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::vector(&local_50,
           &(local_b0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start)->properties);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_b0);
  pNVar2 = local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar7) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    pNVar2 = local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  do {
    if (pNVar2 == local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
LAB_00109f60:
      iVar3 = *fallback;
      std::
      vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::~vector(&local_50);
      std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_68);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
      iVar6 = (int)paVar7;
      if (pNVar2 == local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        iVar6 = iVar3;
      }
      return iVar6;
    }
    pvVar4 = std::
             get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       ((pNVar2->properties).
                        super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    __n = pvVar4->_M_string_length;
    if (__n == property->_M_string_length) {
      if (__n == 0) {
        bVar8 = true;
      }
      else {
        iVar3 = bcmp((pvVar4->_M_dataplus)._M_p,(property->_M_dataplus)._M_p,__n);
        bVar8 = iVar3 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if (bVar8) {
      puVar5 = (uint *)std::
                       get<2ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                                 ((pNVar2->properties).
                                  super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)*puVar5;
      goto LAB_00109f60;
    }
    pNVar2 = pNVar2 + 1;
  } while( true );
}

Assistant:

static T getProperty(const Node &node, const std::string &property, const T &fallback) {
        const Node properties = findNodes(node, "Properties70")[0];

        for (const auto &prop : properties.children)
            if (std::get<std::string>(prop.properties[0]) == property)
                return std::get<T>(prop.properties[4]);
        return fallback;
    }